

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Identifier __thiscall
soul::BlockBuilder::createIdentifier(BlockBuilder *this,char *prefix,uint32_t index)

{
  Identifier IVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,index);
  std::operator+(&bStack_58,prefix,&local_38);
  IVar1 = createIdentifier<std::__cxx11::string>(this,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (Identifier)IVar1.name;
}

Assistant:

Identifier createIdentifier (const char* prefix, uint32_t index)    { return createIdentifier (prefix + std::to_string (index)); }